

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void __thiscall CConsole::DeregisterTemp(CConsole *this,char *pName)

{
  CCommand *pCVar1;
  CCommand *pCVar2;
  int iVar3;
  CCommand *pCVar4;
  CCommand **ppCVar5;
  
  pCVar4 = this->m_pFirstCommand;
  if (pCVar4 != (CCommand *)0x0) {
    if (pCVar4->m_Temp == true) {
      ppCVar5 = &this->m_pFirstCommand;
      iVar3 = str_comp((pCVar4->super_CCommandInfo).m_pName,pName);
      pCVar4 = *ppCVar5;
      if (iVar3 == 0) {
LAB_0012fdba:
        *ppCVar5 = pCVar4->m_pNext;
        pCVar4->m_pNext = this->m_pRecycleList;
        this->m_pRecycleList = pCVar4;
        return;
      }
    }
    pCVar2 = pCVar4->m_pNext;
    pCVar1 = pCVar4;
    while (pCVar4 = pCVar2, pCVar4 != (CCommand *)0x0) {
      ppCVar5 = &pCVar1->m_pNext;
      if (pCVar4->m_Temp == true) {
        iVar3 = str_comp((pCVar4->super_CCommandInfo).m_pName,pName);
        pCVar4 = *ppCVar5;
        if (iVar3 == 0) goto LAB_0012fdba;
      }
      pCVar1 = pCVar4;
      pCVar2 = pCVar4->m_pNext;
    }
  }
  return;
}

Assistant:

void CConsole::DeregisterTemp(const char *pName)
{
	if(!m_pFirstCommand)
		return;

	CCommand *pRemoved = 0;

	// remove temp entry from command list
	if(m_pFirstCommand->m_Temp && str_comp(m_pFirstCommand->m_pName, pName) == 0)
	{
		pRemoved = m_pFirstCommand;
		m_pFirstCommand = m_pFirstCommand->m_pNext;
	}
	else
	{
		for(CCommand *pCommand = m_pFirstCommand; pCommand->m_pNext; pCommand = pCommand->m_pNext)
			if(pCommand->m_pNext->m_Temp && str_comp(pCommand->m_pNext->m_pName, pName) == 0)
			{
				pRemoved = pCommand->m_pNext;
				pCommand->m_pNext = pCommand->m_pNext->m_pNext;
				break;
			}
	}

	// add to recycle list
	if(pRemoved)
	{
		pRemoved->m_pNext = m_pRecycleList;
		m_pRecycleList = pRemoved;
	}
}